

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

uint __thiscall
ON_3dPointListRef::GetPoints
          (ON_3dPointListRef *this,int point_index_count,int *point_index_list,
          ON_SimpleArray<ON_3dPoint> *points)

{
  uint uVar1;
  undefined4 local_3c;
  uint rc;
  ON_SimpleArray<ON_3dPoint> *points_local;
  int *point_index_list_local;
  int point_index_count_local;
  ON_3dPointListRef *this_local;
  
  if (point_index_count < 1) {
    local_3c = 0;
  }
  else {
    local_3c = GetPoints(this,point_index_count,(uint *)point_index_list,points);
  }
  uVar1 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(points);
  if (local_3c < uVar1) {
    ON_SimpleArray<ON_3dPoint>::SetCount(points,local_3c);
  }
  return local_3c;
}

Assistant:

unsigned int ON_3dPointListRef::GetPoints(
  int point_index_count,
  const int* point_index_list,
  ON_SimpleArray<ON_3dPoint>& points
  ) const
{
  unsigned int rc = (point_index_count > 0) 
                  ? GetPoints((unsigned int)point_index_count,(const unsigned int*)point_index_list,points) 
                  : 0;

  if (rc < points.UnsignedCount())
    points.SetCount(rc);

  return rc;
}